

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::basic_substring<const_char>::find
          (basic_substring<const_char> *this,ro_substr pattern,size_t start_pos)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong local_38;
  
  uVar2 = pattern.len;
  uVar3 = this->len;
  if (this->len < start_pos && start_pos != 0xffffffffffffffff) {
    basic_substring<char_const>::find();
    uVar3 = local_38;
  }
  sVar1 = 0xffffffffffffffff;
  if ((uVar2 <= uVar3) && (uVar5 = (uVar3 - uVar2) + 1, uVar3 = start_pos, start_pos < uVar5)) {
    while (sVar1 = start_pos, uVar2 != 0) {
      uVar4 = 0;
      while( true ) {
        if (this->len <= uVar3 + uVar4) {
          basic_substring<char_const>::find();
        }
        if (this->str[uVar4 + uVar3] != pattern.str[uVar4]) break;
        uVar4 = uVar4 + 1;
        if (uVar2 == uVar4) {
          return uVar3;
        }
      }
      uVar3 = uVar3 + 1;
      if (uVar5 <= uVar3) {
        return 0xffffffffffffffff;
      }
    }
  }
  return sVar1;
}

Assistant:

inline size_t find(ro_substr pattern, size_t start_pos=0) const
    {
        C4_ASSERT(start_pos == npos || (start_pos >= 0 && start_pos <= len));
        if(len < pattern.len) return npos;
        for(size_t i = start_pos, e = len - pattern.len + 1; i < e; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < pattern.len; ++j)
            {
                C4_ASSERT(i + j < len);
                if(str[i + j] != pattern.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }